

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlEntityDesc * htmlEntityValueLookup(uint value)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (lVar3 + 0x18 == 0x17d0) {
      return (htmlEntityDesc *)0x0;
    }
    uVar1 = *(uint *)((long)&html40EntitiesTable[0].value + lVar3);
    lVar2 = lVar3 + 0x18;
  } while (uVar1 < value);
  if (value < uVar1) {
    return (htmlEntityDesc *)0x0;
  }
  return (htmlEntityDesc *)((long)&html40EntitiesTable[0].value + lVar3);
}

Assistant:

const htmlEntityDesc *
htmlEntityValueLookup(unsigned int value) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (html40EntitiesTable[i].value >= value) {
	    if (html40EntitiesTable[i].value > value)
		break;
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}